

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

int32_t characterIteratorGetIndex(UCharIterator *iter,UCharIteratorOrigin origin)

{
  UCharIteratorOrigin origin_local;
  UCharIterator *iter_local;
  
  switch(origin) {
  case UITER_START:
    iter_local._4_4_ = icu_63::CharacterIterator::startIndex((CharacterIterator *)iter->context);
    break;
  case UITER_CURRENT:
    iter_local._4_4_ = icu_63::CharacterIterator::getIndex((CharacterIterator *)iter->context);
    break;
  case UITER_LIMIT:
    iter_local._4_4_ = icu_63::CharacterIterator::endIndex((CharacterIterator *)iter->context);
    break;
  case UITER_ZERO:
    iter_local._4_4_ = 0;
    break;
  case UITER_LENGTH:
    iter_local._4_4_ = icu_63::CharacterIterator::getLength((CharacterIterator *)iter->context);
    break;
  default:
    iter_local._4_4_ = -1;
  }
  return iter_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
characterIteratorGetIndex(UCharIterator *iter, UCharIteratorOrigin origin) {
    switch(origin) {
    case UITER_ZERO:
        return 0;
    case UITER_START:
        return ((CharacterIterator *)(iter->context))->startIndex();
    case UITER_CURRENT:
        return ((CharacterIterator *)(iter->context))->getIndex();
    case UITER_LIMIT:
        return ((CharacterIterator *)(iter->context))->endIndex();
    case UITER_LENGTH:
        return ((CharacterIterator *)(iter->context))->getLength();
    default:
        /* not a valid origin */
        /* Should never get here! */
        return -1;
    }
}